

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::CopyNativeIntArrayElementsToVar
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptNativeIntArray *srcArray,
               uint32 start,uint32 end)

{
  code *pcVar1;
  bool bVar2;
  uint *puVar3;
  undefined4 *puVar4;
  uint32 local_28;
  uint local_24;
  uint32 end_local;
  uint32 start_local;
  JavascriptNativeIntArray *srcArray_local;
  JavascriptArray *pJStack_10;
  uint32 dstIndex_local;
  JavascriptArray *dstArray_local;
  
  local_28 = end;
  local_24 = start;
  _end_local = srcArray;
  srcArray_local._4_4_ = dstIndex;
  pJStack_10 = dstArray;
  puVar3 = min<unsigned_int>(&local_28,
                             &(srcArray->super_JavascriptNativeArray).super_JavascriptArray.
                              super_ArrayObject.length);
  local_28 = *puVar3;
  if (local_24 < local_28) {
    if (-srcArray_local._4_4_ - 1 < local_28 - local_24) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2ccf,"(end - start <= MaxArrayLength - dstIndex)",
                                  "end - start <= MaxArrayLength - dstIndex");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    InternalCopyNativeIntArrayElements(pJStack_10,srcArray_local._4_4_,_end_local,local_24,local_28)
    ;
  }
  return;
}

Assistant:

void JavascriptArray::CopyNativeIntArrayElementsToVar(JavascriptArray* dstArray, uint32 dstIndex, JavascriptNativeIntArray* srcArray, uint32 start, uint32 end)
    {
        end = min(end, srcArray->length);
        if (start < end)
        {
            Assert(end - start <= MaxArrayLength - dstIndex);
            InternalCopyNativeIntArrayElements(dstArray, dstIndex, srcArray, start, end);
        }
    }